

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O2

int ON_FindLocalMinimum(_func_int_void_ptr_double_double_ptr_double_ptr *f,void *farg,double ax,
                       double bx,double cx,double rel_stepsize_tol,double abs_stepsize_tol,
                       int max_it,double *t_addr)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  byte bVar4;
  char *sFormat;
  undefined4 uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  ulong in_XMM1_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong uVar24;
  double fx;
  double dx;
  double fu;
  double local_148;
  ulong uStack_140;
  double local_138;
  ulong uStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double du;
  double local_108;
  ulong uStack_100;
  double local_f8;
  double local_f0;
  undefined1 local_e8 [16];
  double local_d0;
  double local_c8;
  ulong uStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  ulong uStack_90;
  double local_88;
  ulong uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  double dStack_40;
  
  if (t_addr == (double *)0x0) {
    sFormat = "t_addr is nullptr";
    iVar3 = 0x4d;
  }
  else {
    *t_addr = bx;
    if (max_it < 2) {
      sFormat = "max_it must be >= 2";
      iVar3 = 0x55;
    }
    else {
      local_148 = ax;
      local_138 = bx;
      uStack_130 = in_XMM1_Qb;
      local_118 = abs_stepsize_tol;
      local_108 = cx;
      local_f0 = rel_stepsize_tol;
      bVar2 = ON_IsValid(rel_stepsize_tol);
      if (((1.0 <= local_f0) || (local_f0 <= 0.0)) || (!bVar2)) {
        sFormat = "rel_stepsize_tol must be strictly between 0.0 and 1.0";
        iVar3 = 0x5a;
      }
      else {
        bVar2 = ON_IsValid(local_118);
        if (0.0 < local_118 && bVar2) {
          iVar3 = (*f)(farg,local_138,&fx,&dx);
          if (iVar3 != 0) {
            if (iVar3 < 0) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                         ,0x6a,"","ON_FindLocalMinimum() f() failed to evaluate.");
            }
            *t_addr = local_138;
            return (uint)(0 < iVar3);
          }
          dVar15 = local_148;
          if (local_148 <= local_108) {
            dVar15 = local_108;
          }
          uVar24 = 0;
          dVar16 = local_148;
          if (local_108 <= local_148) {
            dVar16 = local_108;
          }
          local_128 = dx;
          dStack_120 = dx;
          local_e8 = ZEXT816(0);
          uVar6 = extraout_RDX;
          local_a8 = local_138;
          local_b8 = local_138;
          dVar11 = 0.0;
          dVar9 = fx;
          local_d0 = fx;
          uVar19 = 0;
LAB_0056f4f5:
          uStack_60 = uStack_130 & 0x7fffffffffffffff;
          local_58 = ABS(local_b8) * local_f0 + local_118;
          local_68 = local_58 + local_58;
          local_c8 = -local_58;
          uStack_c0 = uStack_60 ^ 0x8000000000000000;
          dStack_a0 = local_138;
          local_138 = local_b8;
          local_f8 = dVar9;
          dStack_b0 = local_b8;
          uStack_50 = uStack_60;
LAB_0056f566:
          do {
            local_78 = local_a8 - local_b8;
            dStack_70 = dStack_a0 - dStack_b0;
            uVar7 = -max_it;
            local_48 = dStack_a0;
            dStack_40 = dStack_a0;
            do {
              uVar1 = uVar7 + 1;
              if (uVar1 == 1) {
                *t_addr = local_138;
                ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
                           ,0xc0,"","ON_FindLocalMinimum() failed to converge");
                return 2;
              }
              dVar9 = (dVar15 + dVar16) * 0.5;
              dVar14 = dVar15 - dVar16;
              if (ABS(local_138 - dVar9) <= dVar14 * -0.5 + local_68) {
                *t_addr = local_138;
                return 1;
              }
              if (ABS(dVar11) <= local_58) {
LAB_0056f751:
                local_e8._0_8_ =
                     (double)(~-(ulong)(dx < 0.0) & (ulong)dVar16 |
                             -(ulong)(dx < 0.0) & (ulong)dVar15) - local_138;
                auVar13._0_8_ = (double)local_e8._0_8_ * 0.5;
                auVar13._8_8_ = uVar19;
                local_e8._8_8_ = uVar19;
              }
              else {
                auVar20._0_8_ = local_78 * dx;
                auVar20._8_8_ = dStack_70 * dx;
                auVar21._8_8_ = dx - dStack_120;
                auVar21._0_8_ = dx - local_128;
                auVar21 = divpd(auVar20,auVar21);
                auVar22._0_8_ = auVar21._0_8_ & -(ulong)(local_128 != dx);
                auVar22._8_8_ = auVar21._8_8_ & -(ulong)(dStack_120 != dx);
                auVar17._0_8_ = ~-(ulong)(local_128 != dx) & (ulong)(dVar14 + dVar14);
                auVar17._8_8_ = ~-(ulong)(dStack_120 != dx) & (ulong)(dVar14 + dVar14);
                auVar17 = auVar17 | auVar22;
                dVar14 = auVar17._0_8_;
                dVar18 = auVar17._8_8_;
                auVar13._8_4_ = auVar17._8_4_;
                auVar13._0_8_ = dVar18;
                auVar13._12_4_ = auVar17._12_4_;
                auVar23._8_8_ =
                     -(ulong)(0.0 < ((dStack_b0 + dVar18) - dVar15) *
                                    (dVar16 - (dStack_b0 + dVar18)));
                auVar23._0_8_ =
                     -(ulong)(0.0 < ((local_b8 + dVar14) - dVar15) * (dVar16 - (local_b8 + dVar14)))
                ;
                uVar5 = movmskpd((int)uVar6,auVar23);
                bVar2 = (bool)((byte)uVar5 >> 1 & dx * dVar18 <= 0.0);
                bVar4 = dx * dVar14 <= 0.0 & (byte)uVar5;
                if ((bVar2 == false) && (bVar4 == 0)) goto LAB_0056f751;
                if ((bVar4 & bVar2) == 1) {
                  bVar2 = ABS(dVar18) < ABS(dVar14);
                }
                if (bVar2 == false) {
                  auVar13 = auVar17;
                }
                if (ABS(dVar11 * 0.5) < ABS(auVar13._0_8_)) goto LAB_0056f751;
                dVar11 = local_138 + auVar13._0_8_;
                if ((dVar11 - dVar16 < local_68) || (dVar15 - dVar11 < local_68)) {
                  uVar8 = -(ulong)(local_138 <= dVar9);
                  auVar10._0_8_ = uVar8 & (ulong)local_58;
                  auVar10._8_8_ = uStack_130 & uStack_50;
                  auVar12._0_8_ = ~uVar8 & (ulong)local_c8;
                  auVar12._8_8_ = ~uStack_130 & uStack_c0;
                  auVar13 = auVar12 | auVar10;
                }
              }
              local_108 = auVar13._0_8_;
              local_148 = dVar16;
              uStack_140 = uVar19;
              local_98 = (double)local_e8._0_8_;
              uStack_90 = local_e8._8_8_;
              local_e8 = auVar13;
              local_88 = dVar15;
              uStack_80 = uVar24;
              if (ABS(local_108) < local_58) {
                local_108 = (double)(~-(ulong)(local_108 < 0.0) & (ulong)local_58 |
                                    -(ulong)(local_108 < 0.0) & (ulong)local_c8) + local_138;
                uStack_100 = uStack_50;
                iVar3 = (*f)(farg,local_108,&fu,&du);
                if (-1 < iVar3) {
                  uVar6 = extraout_RDX_00;
                  if (fx < fu) {
                    *t_addr = local_138;
                    return 1;
                  }
                  goto LAB_0056f7fc;
                }
LAB_0056fab0:
                sFormat = "ON_FindLocalMinimum() f() failed to evaluate.";
                iVar3 = 0xa9;
                goto LAB_0056f469;
              }
              local_108 = local_138 + local_108;
              uStack_100 = uStack_130;
              iVar3 = (*f)(farg,local_108,&fu,&du);
              uVar6 = extraout_RDX_01;
LAB_0056f7fc:
              if (iVar3 != 0) {
                if (-1 < iVar3) {
                  *t_addr = (double)(~-(ulong)(fu < fx) & (ulong)local_138 |
                                    (ulong)local_108 & -(ulong)(fu < fx));
                  return 1;
                }
                goto LAB_0056fab0;
              }
              dVar11 = local_98;
              if (fu <= fx) {
                if (local_138 <= local_108) {
                  local_148 = local_138;
                  uStack_140 = uStack_130;
                }
                max_it = ~uVar7;
                dVar15 = (double)(~-(ulong)(local_108 < local_138) & (ulong)local_88 |
                                 -(ulong)(local_108 < local_138) & (ulong)local_138);
                uVar24 = ~uStack_130 & uStack_80 | uStack_130;
                local_128 = dStack_120;
                dStack_120 = dx;
                local_a8 = dStack_a0;
                local_b8 = local_108;
                uStack_130 = uStack_100;
                dVar9 = fx;
                local_d0 = local_f8;
                dVar16 = local_148;
                uVar19 = uStack_140;
                fx = fu;
                dx = du;
                goto LAB_0056f4f5;
              }
              dVar16 = local_108;
              uVar19 = uStack_100;
              if (local_138 <= local_108) {
                dVar16 = local_148;
                uVar19 = uStack_140;
              }
              uVar24 = uStack_80 & uStack_100;
              dVar15 = (double)((ulong)local_88 & -(ulong)(local_108 < local_138) |
                               ~-(ulong)(local_108 < local_138) & (ulong)local_108);
              if (fu <= local_f8) {
LAB_0056f973:
                local_128 = dStack_120;
                max_it = ~uVar7;
                local_a8 = dStack_a0;
                dStack_a0 = local_108;
                local_d0 = local_f8;
                dStack_120 = du;
                local_f8 = fu;
                goto LAB_0056f566;
              }
              if ((local_48 == local_138) && (!NAN(local_48) && !NAN(local_138))) goto LAB_0056f973;
              if (fu < local_d0) break;
              if ((local_a8 == local_138) && (!NAN(local_a8) && !NAN(local_138))) break;
              uVar7 = uVar1;
            } while ((local_a8 != local_48) || (NAN(local_a8) || NAN(local_48)));
            local_128 = du;
            max_it = -uVar1;
            local_a8 = local_108;
            local_d0 = fu;
          } while( true );
        }
        sFormat = "abs_stepsize_tol must be > 0";
        iVar3 = 0x5f;
      }
    }
  }
LAB_0056f469:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_optimize.cpp"
             ,iVar3,"",sFormat);
  return 0;
}

Assistant:

int ON_FindLocalMinimum(
                int (*f)(void*,double,double*,double*), void* farg,
                double ax, double bx, double cx,
                double rel_stepsize_tol, double abs_stepsize_tol, int max_it, 
                double *t_addr
                )
/* Use Brent's algorithm (with derivative) to Find a (local) minimum of a function
 *
 * INPUT:
 *   ax, bx, cx a bracketed minimum satisfying conditions 1 and 2.
 *      1) either ax < bx < cx or cx < bx < ax.
 *      2) f(bx) < f(ax) and f(bx) < f(ax).
 *   farg
 *      pointer passed to function f()
 *   f
 *      evaluation function with prototype
 *              int f(void* farg,double t,double* ft,double* dft)
 *      f(farg,t,&ft,&dft) should compute ft = value of function at t
 *      and dft = value of derivative at t.
 *      -1: failure
 *       0: success
 *       1: |f(x)| is small enough - TL_NRdbrent() will return *t_addr = x
 *          and the return code 1.
 *   rel_stepsize_tol, abs_stepsize_tol  (0 < rel_stepsize_tol < 1 and 0 < abs_stepsize_tol)
 *      rel_stepsize_tol is a fractional tolerance and abs_stepsize_tol is an absolute tolerance
 *      that determine the minimum step size for a given iteration.
 *        minimum delta t = rel_stepsize_tol*|t| + abs_stepsize_tol.
 *      When in doubt, use 
 *         rel_stepsize_tol = ON_EPSILON 
 *         abs_stepsize_tol = 1/2*(desired absolute precision for *t_addr).
 *   max_it ( >= 2)
 *      maximum number of iterations to permit (when in doubt use 100)
 *      Closest Point to bezier minimizations typically take < 30
 *      iterations.
 *
 * OUTPUT:
 *   *t_addr abcissa of a local minimum between ax and cx.
 *       0: failure
 *       1: success
 *       2: After max_iteration_cnt iterations the tolerance restrictions
 *          where not satisfied.  Try increasing max_it, rel_stepsize_tol and/or abs_stepsize_tol
 *          or use the value of (*t_addr) with extreme caution.
 */
{
  // See Numerical Recipes in C's dbrent() for a description of the basic algorithm
  int rc,ok1,ok2;
  double a,b,d,d1,d2,du,dv,dw,dx,e,fu,fv,fw,fx,olde,tol1,tol2,u,u1,u2,v,w,x,xm;

  d=e=0.0;

  if ( 0 == t_addr )
  {
    ON_ERROR("t_addr is nullptr");
    return 0;
  }

  *t_addr = bx;

  if ( max_it < 2 )
  {
    ON_ERROR("max_it must be >= 2");
    return 0;
  }
  if ( !ON_IsValid(rel_stepsize_tol) || rel_stepsize_tol <= 0.0 || rel_stepsize_tol >= 1.0 )
  {
    ON_ERROR("rel_stepsize_tol must be strictly between 0.0 and 1.0");
    return 0;
  }
  if ( !ON_IsValid(abs_stepsize_tol) || abs_stepsize_tol <= 0.0 )
  {
    ON_ERROR("abs_stepsize_tol must be > 0");
    return 0;
  }

  a=(ax < cx ? ax : cx);
  b=(ax > cx ? ax : cx);
  x=w=v=bx;
  rc = f(farg,x,&fx,&dx);
  if (rc) {
     // f() returned nonzero return code which means we need to bailout
    if ( rc < 0 ) {
      ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
    }
    *t_addr = x;
    return rc>0 ? 1 : 0; // return 1 means f() said result is good enough, return = 0 means f() failed
  }
  fw=fv=fx;
  dw=dv=dx;
  while(max_it--) {
    xm=0.5*(a+b);
    tol1=rel_stepsize_tol*fabs(x)+abs_stepsize_tol;
    tol2=2.0*tol1;
    if (fabs(x-xm) <= (tol2-0.5*(b-a))) {
      // further adjustments to x are smaller than stepsize tolerance
      *t_addr=x;
      return 1;
    }
    if (fabs(e) > tol1) {
      d1=2.0*(b-a);
      d2=d1;
      if (dw != dx) d1=(w-x)*dx/(dx-dw);
      if (dv != dx) d2=(v-x)*dx/(dx-dv);
      u1=x+d1;
      u2=x+d2;
      ok1 = (a-u1)*(u1-b) > 0.0 && dx*d1 <= 0.0;
      ok2 = (a-u2)*(u2-b) > 0.0 && dx*d2 <= 0.0;
      olde=e;
      e=d;
      if (ok1 || ok2) {
        if (ok1 && ok2)
          d=(fabs(d1) < fabs(d2) ? d1 : d2);
        else if (ok1)
          d=d1;
        else
          d=d2;
        if (fabs(d) <= fabs(0.5*olde)) {
          u=x+d;
          if (u-a < tol2 || b-u < tol2)
            {d = (xm >= x) ? tol1 : -tol1;}
        } else {
          d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
        }
      } else {
        d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
      }
    } else {
      d=0.5*(e=(dx >= 0.0 ? a-x : b-x));
    }
    if (fabs(d) >= tol1) {
      u=x+d;
      rc = f(farg,u,&fu,&du);
    }
    else {
      u = (d >= 0.0) ? x+tol1 : x-tol1;
      rc = f(farg,u,&fu,&du);
      if (rc >= 0 && fu > fx) {
        // tweaking x any more increases function value - x is a numerical minimum
        *t_addr=x;
        return 1;
      }
    }
    if (rc) {
      // f() returned nonzero return code which means we need to bailout
      if ( rc < 0 ) {
        ON_ERROR("ON_FindLocalMinimum() f() failed to evaluate.");
      }
      else {
        *t_addr = (fu < fx) ? u : x;
      }
      return rc>0 ? 1 : 0;
    }
    if (fu <= fx) {
      if (u >= x) a=x; else b=x;
      v=w;fv=fw;dv=dw;
      w=x;fw=fx;dw=dx;
      x=u;fx=fu;dx=du;
    } else {
      if (u < x) a=u; else b=u;
      if (fu <= fw || w == x) {
        v=w;fv=fw;dv=dw;
        w=u;fw=fu;dw=du;
      } else if (fu < fv || v == x || v == w) {
        v=u;fv=fu;dv=du;
      }
    }
  }
  *t_addr = x; // best known answer
  ON_ERROR("ON_FindLocalMinimum() failed to converge");
  return 2; // 2 means we failed to converge
}